

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_scan.cpp
# Opt level: O3

bool __thiscall
duckdb::PhysicalPositionalScan::Equals(PhysicalPositionalScan *this,PhysicalOperator *other_p)

{
  pointer prVar1;
  pointer prVar2;
  PhysicalOperator *pPVar3;
  char cVar4;
  PhysicalPositionalScan *pPVar6;
  const_reference pvVar7;
  size_type __n;
  int iVar5;
  
  if ((this->super_PhysicalOperator).type != other_p->type) {
    return false;
  }
  pPVar6 = PhysicalOperator::Cast<duckdb::PhysicalPositionalScan>(other_p);
  prVar1 = (this->child_tables).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar2 = (this->child_tables).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)prVar2 - (long)prVar1 ==
      (long)(pPVar6->child_tables).
            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pPVar6->child_tables).
            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    if (prVar2 == prVar1) {
      cVar4 = '\x01';
    }
    else {
      __n = 0;
      do {
        pvVar7 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                           (&this->child_tables,__n);
        pPVar3 = pvVar7->_M_data;
        pvVar7 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                           (&pPVar6->child_tables,__n);
        iVar5 = (*pPVar3->_vptr_PhysicalOperator[6])(pPVar3,pvVar7->_M_data);
        cVar4 = (char)iVar5;
        if (cVar4 == '\0') {
          return false;
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(this->child_tables).
                                   super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                   .
                                   super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->child_tables).
                                   super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                   .
                                   super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  else {
    cVar4 = '\0';
  }
  return (bool)cVar4;
}

Assistant:

bool PhysicalPositionalScan::Equals(const PhysicalOperator &other_p) const {
	if (type != other_p.type) {
		return false;
	}

	auto &other = other_p.Cast<PhysicalPositionalScan>();
	if (child_tables.size() != other.child_tables.size()) {
		return false;
	}
	for (size_t i = 0; i < child_tables.size(); ++i) {
		if (!child_tables[i].get().Equals(other.child_tables[i])) {
			return false;
		}
	}

	return true;
}